

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDocCopyNode(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val;
  xmlDocPtr val_00;
  xmlNodePtr val_01;
  int local_3c;
  int n_extended;
  int extended;
  int n_doc;
  xmlDocPtr doc;
  int n_node;
  xmlNodePtr node;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 3; doc._4_4_ = doc._4_4_ + 1) {
    for (n_extended = 0; n_extended < 4; n_extended = n_extended + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlNodePtr(doc._4_4_,0);
        val_00 = gen_xmlDocPtr(n_extended,1);
        iVar2 = gen_int(local_3c,2);
        val_01 = (xmlNodePtr)xmlDocCopyNode(val,val_00,iVar2);
        desret_xmlNodePtr(val_01);
        call_tests = call_tests + 1;
        des_xmlNodePtr(doc._4_4_,val,0);
        des_xmlDocPtr(n_extended,val_00,1);
        des_int(local_3c,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocCopyNode",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)doc._4_4_);
          printf(" %d",(ulong)(uint)n_extended);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlDocCopyNode(void) {
    int test_ret = 0;

    int mem_base;
    xmlNodePtr ret_val;
    xmlNodePtr node; /* the node */
    int n_node;
    xmlDocPtr doc; /* the document */
    int n_doc;
    int extended; /* if 1 do a recursive copy (properties, namespaces and children when applicable) if 2 copy properties and namespaces (when applicable) */
    int n_extended;

    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_extended = 0;n_extended < gen_nb_int;n_extended++) {
        mem_base = xmlMemBlocks();
        node = gen_xmlNodePtr(n_node, 0);
        doc = gen_xmlDocPtr(n_doc, 1);
        extended = gen_int(n_extended, 2);

        ret_val = xmlDocCopyNode(node, doc, extended);
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlNodePtr(n_node, node, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        des_int(n_extended, extended, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDocCopyNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_doc);
            printf(" %d", n_extended);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}